

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

intptr_t xemmai::anon_unknown_16::f_zone_to_offset(wchar_t *a_zone)

{
  int iVar1;
  intptr_t iVar2;
  intptr_t a_military;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  
  iVar2 = 0;
  switch(*a_zone) {
  case L'+':
  case L'-':
    iVar1 = iswdigit(a_zone[1]);
    if ((iVar1 != 0) && (iVar1 = iswdigit(a_zone[2]), iVar1 != 0)) {
      uVar4 = (ulong)(a_zone[3] == L':');
      iVar1 = iswdigit(a_zone[uVar4 + 3]);
      if (iVar1 != 0) {
        iVar1 = iswdigit(a_zone[uVar4 + 4]);
        if ((iVar1 != 0) && (a_zone[uVar4 + 5] == L'\0')) {
          lVar3 = 0x3c;
          if (*a_zone == L'-') {
            lVar3 = -0x3c;
          }
          return ((long)(a_zone[1] * 10 + a_zone[2] + -0x210) * 0x3c +
                 (long)(a_zone[uVar4 + 3] * 10 + a_zone[uVar4 + 4] + -0x210)) * lVar3;
        }
      }
    }
    return 0;
  default:
    goto switchD_001055ea_caseD_2c;
  case L'A':
  case L'a':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = 0xe10;
    break;
  case L'B':
  case L'b':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = 0x1c20;
    break;
  case L'C':
  case L'c':
    a_military = 3;
    iVar2 = -6;
    goto LAB_00105779;
  case L'D':
  case L'd':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = 0x3840;
    break;
  case L'E':
  case L'e':
    a_military = 5;
    iVar2 = -5;
    goto LAB_00105779;
  case L'F':
  case L'f':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = 0x5460;
    break;
  case L'G':
  case L'g':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = 0x6270;
    break;
  case L'H':
  case L'h':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = 0x7080;
    break;
  case L'I':
  case L'i':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = 0x7e90;
    break;
  case L'K':
  case L'k':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = 36000;
    break;
  case L'L':
  case L'l':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = 0x9ab0;
    break;
  case L'M':
  case L'm':
    a_military = 0xc;
    iVar2 = -7;
    goto LAB_00105779;
  case L'N':
  case L'n':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = -0xe10;
    break;
  case L'O':
  case L'o':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = -0x1c20;
    break;
  case L'P':
  case L'p':
    a_military = -3;
    iVar2 = -8;
LAB_00105779:
    iVar2 = f_zone_to_offset_us(a_zone,a_military,iVar2);
    return iVar2;
  case L'Q':
  case L'q':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = -0x3840;
    break;
  case L'R':
  case L'r':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = -18000;
    break;
  case L'S':
  case L's':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = -0x5460;
    break;
  case L'T':
  case L't':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = -0x6270;
    break;
  case L'U':
  case L'u':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = -0x7080;
    break;
  case L'V':
  case L'v':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = -0x7e90;
    break;
  case L'W':
  case L'w':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = -36000;
    break;
  case L'X':
  case L'x':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = -0x9ab0;
    break;
  case L'Y':
  case L'y':
    bVar5 = a_zone[1] == L'\0';
    iVar2 = -0xa8c0;
  }
  if (!bVar5) {
    iVar2 = 0;
  }
switchD_001055ea_caseD_2c:
  return iVar2;
}

Assistant:

intptr_t f_zone_to_offset(const wchar_t* a_zone)
{
	switch (a_zone[0]) {
	case L'+':
	case L'-':
		if (std::iswdigit(a_zone[1]) && std::iswdigit(a_zone[2])) {
			size_t i = a_zone[3] == L':' ? 4 : 3;
			if (!std::iswdigit(a_zone[i]) || !std::iswdigit(a_zone[i + 1]) || a_zone[i + 2] != L'\0') return 0;
			intptr_t hour = (a_zone[1] - L'0') * 10 + (a_zone[2] - L'0');
			intptr_t minute = (a_zone[i] - L'0') * 10 + (a_zone[i + 1] - L'0');
			return (a_zone[0] == L'-' ? -60 : 60) * (hour * 60 + minute);
		} else {
			return 0;
		}
	case L'A':
	case L'a':
		return a_zone[1] == L'\0' ? 1 * 3600 : 0;
	case L'B':
	case L'b':
		return a_zone[1] == L'\0' ? 2 * 3600 : 0;
	case L'C':
	case L'c':
		return f_zone_to_offset_us(a_zone, 3, -6);
	case L'D':
	case L'd':
		return a_zone[1] == L'\0' ? 4 * 3600 : 0;
	case L'E':
	case L'e':
		return f_zone_to_offset_us(a_zone, 5, -5);
	case L'F':
	case L'f':
		return a_zone[1] == L'\0' ? 6 * 3600 : 0;
	case L'G':
	case L'g':
		return a_zone[1] == L'\0' ? 7 * 3600 : 0;
	case L'H':
	case L'h':
		return a_zone[1] == L'\0' ? 8 * 3600 : 0;
	case L'I':
	case L'i':
		return a_zone[1] == L'\0' ? 9 * 3600 : 0;
	case L'K':
	case L'k':
		return a_zone[1] == L'\0' ? 10 * 3600 : 0;
	case L'L':
	case L'l':
		return a_zone[1] == L'\0' ? 11 * 3600 : 0;
	case L'M':
	case L'm':
		return f_zone_to_offset_us(a_zone, 12, -7);
	case L'N':
	case L'n':
		return a_zone[1] == L'\0' ? -1 * 3600 : 0;
	case L'O':
	case L'o':
		return a_zone[1] == L'\0' ? -2 * 3600 : 0;
	case L'P':
	case L'p':
		return f_zone_to_offset_us(a_zone, -3, -8);
	case L'Q':
	case L'q':
		return a_zone[1] == L'\0' ? -4 * 3600 : 0;
	case L'R':
	case L'r':
		return a_zone[1] == L'\0' ? -5 * 3600 : 0;
	case L'S':
	case L's':
		return a_zone[1] == L'\0' ? -6 * 3600 : 0;
	case L'T':
	case L't':
		return a_zone[1] == L'\0' ? -7 * 3600 : 0;
	case L'U':
	case L'u':
		return a_zone[1] == L'\0' ? -8 * 3600 : 0;
	case L'V':
	case L'v':
		return a_zone[1] == L'\0' ? -9 * 3600 : 0;
	case L'W':
	case L'w':
		return a_zone[1] == L'\0' ? -10 * 3600 : 0;
	case L'X':
	case L'x':
		return a_zone[1] == L'\0' ? -11 * 3600 : 0;
	case L'Y':
	case L'y':
		return a_zone[1] == L'\0' ? -12 * 3600 : 0;
	default:
		return 0;
	}
}